

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O1

int CfdGetTapBranchData(void *handle,void *tree_handle,uint8_t index_from_leaf,bool is_root_data,
                       char **branch_hash,uint8_t *leaf_version,char **tapscript,
                       uint8_t *depth_by_leaf_or_end)

{
  undefined8 uVar1;
  bool bVar2;
  uint8_t uVar3;
  ulong uVar4;
  CfdException *this;
  ulong uVar5;
  uint8_t uVar6;
  TapBranch *this_00;
  char *work_branch_hash;
  char *work_tapscript;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> branches;
  TapBranch branch_data;
  undefined1 local_158 [16];
  undefined1 local_148 [112];
  pointer local_d8;
  string local_c8;
  TapBranch local_a8;
  
  local_148._96_8_ = (pointer)0x0;
  local_148._88_8_ = (pointer)0x0;
  local_148._80_8_ = handle;
  cfd::Initialize();
  local_a8._vptr_TapBranch = (_func_int **)&local_a8.script_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_a8);
  if ((Script *)local_a8._vptr_TapBranch != &local_a8.script_) {
    operator_delete(local_a8._vptr_TapBranch);
  }
  this_00 = (TapBranch *)**(long **)((long)tree_handle + 0x18);
  if (this_00 == (TapBranch *)(*(long **)((long)tree_handle + 0x18))[1]) {
    this_00 = (TapBranch *)**(long **)((long)tree_handle + 0x10);
    if ((TapBranch *)(*(long **)((long)tree_handle + 0x10))[1] == this_00) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
  }
  cfd::core::ByteData256::ByteData256((ByteData256 *)(local_148 + 0x30));
  cfd::core::TapBranch::TapBranch(&local_a8);
  cfd::core::TapBranch::GetBranchList
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
             (local_148 + 0x68),this_00);
  uVar4 = ((long)local_d8 - local_148._104_8_ >> 3) * -0x1111111111111111;
  uVar5 = (ulong)index_from_leaf;
  if ((uint)index_from_leaf < (uint)uVar4) {
    if (is_root_data) {
      cfd::core::TapBranch::GetBranchHash((ByteData256 *)local_158,this_00,index_from_leaf);
      uVar1 = local_148._48_8_;
      local_148._48_8_ = local_158._0_8_;
      local_148._56_8_ = local_158._8_8_;
      local_148._64_8_ = local_148._0_8_;
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      local_148._0_8_ = (pointer)0x0;
      if ((pointer)uVar1 != (pointer)0x0) {
        operator_delete((void *)uVar1);
      }
      if ((pointer)local_158._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_158._0_8_);
      }
      bVar2 = false;
      uVar6 = '\0';
    }
    else {
      if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                   ,uVar4);
      }
      cfd::core::TapBranch::operator=(&local_a8,(TapBranch *)(local_148._104_8_ + uVar5 * 0x78));
      cfd::core::TapBranch::GetCurrentBranchHash((ByteData256 *)local_158,&local_a8);
      uVar1 = local_148._48_8_;
      local_148._48_8_ = local_158._0_8_;
      local_148._56_8_ = local_158._8_8_;
      local_148._64_8_ = local_148._0_8_;
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      local_148._0_8_ = (pointer)0x0;
      if ((pointer)uVar1 != (pointer)0x0) {
        operator_delete((void *)uVar1);
      }
      if ((pointer)local_158._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_158._0_8_);
      }
      bVar2 = cfd::core::TapBranch::HasTapLeaf(&local_a8);
      cfd::core::TapBranch::GetBranchList
                ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)local_158,
                 &local_a8);
      uVar6 = (char)((uint)(local_158._8_4_ - local_158._0_4_) >> 3) * -0x11;
      std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
                ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)local_158);
    }
    if (bVar2 == true && tapscript != (char **)0x0) {
      cfd::core::TapBranch::GetScript((Script *)local_158,&local_a8);
      cfd::core::Script::GetHex_abi_cxx11_(&local_c8,(Script *)local_158);
      local_148._96_8_ = cfd::capi::CreateString(&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      cfd::core::Script::~Script((Script *)local_158);
    }
    if (branch_hash != (char **)0x0) {
      cfd::core::ByteData256::GetHex_abi_cxx11_
                ((string *)local_158,(ByteData256 *)(local_148 + 0x30));
      local_148._88_8_ = cfd::capi::CreateString((string *)local_158);
      if ((pointer)local_158._0_8_ != (pointer)local_148) {
        operator_delete((void *)local_158._0_8_);
      }
    }
    if (leaf_version != (uint8_t *)0x0) {
      if (bVar2 == false) {
        uVar3 = '\0';
      }
      else {
        uVar3 = cfd::core::TapBranch::GetLeafVersion(&local_a8);
      }
      *leaf_version = uVar3;
    }
    if (depth_by_leaf_or_end != (uint8_t *)0x0) {
      *depth_by_leaf_or_end = uVar6;
    }
    if (tapscript != (char **)0x0) {
      *tapscript = (char *)local_148._96_8_;
    }
    if (branch_hash != (char **)0x0) {
      *branch_hash = (char *)local_148._88_8_;
    }
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
               (local_148 + 0x68));
    cfd::core::TapBranch::~TapBranch(&local_a8);
    if ((pointer)local_148._48_8_ != (pointer)0x0) {
      operator_delete((void *)local_148._48_8_);
    }
    return 0;
  }
  local_158._0_8_ = "cfdcapi_script.cpp";
  local_158._8_4_ = 0x3a0;
  local_148._0_8_ = "CfdGetTapBranchData";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_158,kCfdLogLevelWarning,"index_from_leaf is out of range.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_158._0_8_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_158,"Failed to parameter. index_from_leaf is out of range.","");
  cfd::core::CfdException::CfdException(this,kCfdOutOfRangeError,(string *)local_158);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTapBranchData(
    void* handle, void* tree_handle, uint8_t index_from_leaf,
    bool is_root_data, char** branch_hash, uint8_t* leaf_version,
    char** tapscript, uint8_t* depth_by_leaf_or_end) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_tapscript = nullptr;
  char* work_branch_hash = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    TapBranch* branch;
    if (!buffer->branch_buffer->empty()) {
      branch = &buffer->branch_buffer->at(0);
    } else {
      branch = &buffer->tree_buffer->at(0);
    }

    ByteData256 hash_obj;
    TapBranch branch_data;
    bool has_leaf = false;
    uint8_t branch_count = 0;
    auto branches = branch->GetBranchList();
    uint32_t max = static_cast<uint32_t>(branches.size());
    if (max <= index_from_leaf) {
      warn(CFD_LOG_SOURCE, "index_from_leaf is out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index_from_leaf is out of range.");
    }
    if (is_root_data) {
      hash_obj = branch->GetBranchHash(index_from_leaf);
    } else {
      branch_data = branches.at(index_from_leaf);
      hash_obj = branch_data.GetCurrentBranchHash();
      has_leaf = branch_data.HasTapLeaf();
      branch_count = static_cast<uint8_t>(branch_data.GetBranchList().size());
    }

    if (has_leaf && (tapscript != nullptr)) {
      work_tapscript = CreateString(branch_data.GetScript().GetHex());
    }
    if (branch_hash != nullptr) {
      work_branch_hash = CreateString(hash_obj.GetHex());
    }

    if (leaf_version != nullptr) {
      *leaf_version = (has_leaf) ? branch_data.GetLeafVersion() : 0;
    }
    if (depth_by_leaf_or_end != nullptr) *depth_by_leaf_or_end = branch_count;
    if (tapscript != nullptr) *tapscript = work_tapscript;
    if (branch_hash != nullptr) *branch_hash = work_branch_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_tapscript, &work_branch_hash);
  return result;
}